

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_slice(HSQUIRRELVM v)

{
  SQArray *this;
  SQArray *val;
  SQSharedState *in_RDI;
  SQInteger i;
  SQInteger count;
  SQObjectPtr t;
  SQArray *arr;
  SQInteger alen;
  SQObjectPtr o;
  SQInteger eidx;
  SQInteger sidx;
  SQObjectPtr *in_stack_ffffffffffffff48;
  SQSharedState *in_stack_ffffffffffffff50;
  SQInteger in_stack_ffffffffffffff60;
  SQArray *in_stack_ffffffffffffff68;
  SQObjectPtr *this_00;
  SQInteger *in_stack_ffffffffffffff78;
  HSQUIRRELVM in_stack_ffffffffffffff80;
  long local_70;
  SQObjectPtr local_60;
  SQArray *local_50;
  SQInteger local_48;
  undefined4 local_40;
  SQObjectPtr local_30;
  long local_20;
  long local_18;
  SQSharedState *local_10;
  SQRESULT local_8;
  
  this_00 = &local_30;
  local_10 = in_RDI;
  SQObjectPtr::SQObjectPtr(this_00);
  this = (SQArray *)
         get_slice_params(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(SQInteger *)this_00,
                          (SQObjectPtr *)in_stack_ffffffffffffff68);
  if (this == (SQArray *)0xffffffffffffffff) {
    local_8 = -1;
    local_40 = 1;
  }
  else {
    local_48 = SQArray::Size((SQArray *)0x141331);
    if (local_18 < 0) {
      local_18 = local_48 + local_18;
    }
    if (local_20 < 0) {
      local_20 = local_48 + local_20;
    }
    if (local_20 < local_18) {
      local_8 = sq_throwerror((HSQUIRRELVM)in_stack_ffffffffffffff50,
                              (SQChar *)in_stack_ffffffffffffff48);
      local_40 = 1;
    }
    else if ((local_48 < local_20) || (local_18 < 0)) {
      local_8 = sq_throwerror((HSQUIRRELVM)in_stack_ffffffffffffff50,
                              (SQChar *)in_stack_ffffffffffffff48);
      local_40 = 1;
    }
    else {
      val = SQArray::Create(in_stack_ffffffffffffff50,(SQInteger)in_stack_ffffffffffffff48);
      local_50 = val;
      SQObjectPtr::SQObjectPtr(&local_60);
      for (local_70 = local_18; local_70 < local_20; local_70 = local_70 + 1) {
        SQArray::Get(this,(SQInteger)this_00,(SQObjectPtr *)in_stack_ffffffffffffff68);
        SQArray::Set(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(SQObjectPtr *)val);
      }
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff80,local_50);
      SQVM::Push((SQVM *)local_10,in_stack_ffffffffffffff48);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
      local_8 = 1;
      local_40 = 1;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
      in_stack_ffffffffffffff50 = local_10;
    }
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
  return local_8;
}

Assistant:

static SQInteger array_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(get_slice_params(v,sidx,eidx,o)==-1)return -1;
    SQInteger alen = _array(o)->Size();
    if(sidx < 0)sidx = alen + sidx;
    if(eidx < 0)eidx = alen + eidx;
    if(eidx < sidx)return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > alen || sidx < 0)return sq_throwerror(v, _SC("slice out of range"));
    SQArray *arr=SQArray::Create(_ss(v),eidx-sidx);
    SQObjectPtr t;
    SQInteger count=0;
    for(SQInteger i=sidx;i<eidx;i++){
        _array(o)->Get(i,t);
        arr->Set(count++,t);
    }
    v->Push(arr);
    return 1;

}